

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

bool __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::DivId>_>
::ConvertAllNewWith(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::DivId>_>
                    *this,BasicFlatConverter *cvt)

{
  bool bVar1;
  int *in_stack_00000038;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::DivId>_>
  *in_stack_00000040;
  exception *exc;
  
  bVar1 = ConvertAllFrom(in_stack_00000040,in_stack_00000038);
  return bVar1;
}

Assistant:

bool ConvertAllNewWith(BasicFlatConverter& cvt) override {
    assert(&cvt == &GetConverter());         // Using the same Converter
    MP_UNUSED(cvt);
    try {
      return ConvertAllFrom(i_cvt_last_);
    } catch (const std::exception& exc) {
      MP_RAISE(Converter::GetTypeName() + std::string(": ")
                             + exc.what());
    }
    return false;
  }